

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetisWriter.cc
# Opt level: O3

void writeMetisLine(ofstream *outputfile,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *neighbors)

{
  ostream_type *poVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  ostream_type *poVar7;
  pointer __value;
  char *pcVar8;
  ostream_type *poVar9;
  string untrimmed_neighbor_str;
  stringstream node_list_stream;
  allocator local_1f1;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_1f0;
  ostream_type local_1e0 [16];
  char *local_1d0;
  char local_1c0 [16];
  stringstream local_1b0 [16];
  ostream_type local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  __value = (neighbors->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1f0._M_stream = local_1a0;
  local_1f0._M_string = " ";
  lVar4 = (long)(neighbors->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)__value >> 3;
  if (0 < lVar4) {
    uVar5 = lVar4 + 1;
    do {
      std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::operator=
                (&local_1f0,__value);
      __value = __value + 1;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_1f0,local_1d0,&local_1f1);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  poVar1 = local_1f0._M_stream;
  pcVar8 = local_1f0._M_string;
  if (0 < (long)local_1f0._M_string >> 2) {
    pcVar8 = (char *)(ulong)((uint)local_1f0._M_string & 3);
    lVar4 = ((long)local_1f0._M_string >> 2) + 1;
    pcVar6 = local_1f0._M_string;
    do {
      iVar2 = isspace((int)(char)(poVar1 + -1)[(long)pcVar6]);
      if (iVar2 == 0) {
        poVar7 = (ostream_type *)(pcVar6 + (long)poVar1);
        goto LAB_0010da1d;
      }
      iVar2 = isspace((int)(char)(poVar1 + -2)[(long)pcVar6]);
      if (iVar2 == 0) {
        poVar7 = (ostream_type *)(pcVar6 + (long)poVar1 + -1);
        goto LAB_0010da1d;
      }
      iVar2 = isspace((int)(char)(poVar1 + -3)[(long)pcVar6]);
      if (iVar2 == 0) {
        poVar7 = (ostream_type *)(pcVar6 + (long)poVar1 + -2);
        goto LAB_0010da1d;
      }
      iVar2 = isspace((int)(char)(poVar1 + -4)[(long)pcVar6]);
      if (iVar2 == 0) {
        poVar7 = (ostream_type *)(pcVar6 + (long)poVar1 + -3);
        goto LAB_0010da1d;
      }
      pcVar6 = pcVar6 + -4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  poVar9 = (ostream_type *)(pcVar8 + (long)poVar1);
  lVar4 = (long)poVar9 - (long)poVar1;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      poVar7 = poVar1;
      if ((lVar4 != 3) || (iVar2 = isspace((int)(char)poVar9[-1]), poVar7 = poVar9, iVar2 == 0))
      goto LAB_0010da1d;
      poVar9 = poVar9 + -1;
    }
    iVar2 = isspace((int)(char)poVar9[-1]);
    poVar7 = poVar9;
    if (iVar2 == 0) goto LAB_0010da1d;
    poVar9 = poVar9 + -1;
  }
  iVar2 = isspace((int)(char)poVar9[-1]);
  poVar7 = poVar9;
  if (iVar2 != 0) {
    poVar7 = poVar1;
  }
LAB_0010da1d:
  local_1f0._M_string = (char *)(poVar7 + -(long)poVar1);
  *poVar7 = (ostream_type)0x0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)outputfile,(char *)local_1f0._M_stream,(long)local_1f0._M_string);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_1f0._M_stream != local_1e0) {
    operator_delete(local_1f0._M_stream);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void writeMetisLine(std::ofstream* outputfile,
            const std::vector<uint64_t>& neighbors) {
        std::stringstream node_list_stream;
        std::copy(neighbors.begin(),
                neighbors.end(),
                std::ostream_iterator<uint64_t>(node_list_stream, " "));
        std::string untrimmed_neighbor_str = node_list_stream.str().c_str();
        *outputfile << rtrim(&untrimmed_neighbor_str) << std::endl;
    }